

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O3

void __thiscall
xLearn::AccMetric::Accumulate
          (AccMetric *this,vector<float,_std::allocator<float>_> *Y,
          vector<float,_std::allocator<float>_> *pred)

{
  ThreadPool *pTVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ostream *poVar5;
  index_t iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sum;
  Logger local_9c;
  vector<float,_std::allocator<float>_> *local_98;
  string local_90;
  vector<float,_std::allocator<float>_> *local_70;
  vector<float,_std::allocator<float>_> *local_68;
  string local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  uVar2 = (long)(Y->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(Y->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start;
  local_98 = Y;
  if (uVar2 != (long)(pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_start) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_9c.severity_ = ERR;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/metric.h"
               ,"");
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Accumulate","");
    poVar5 = Logger::Start(ERR,&local_90,0x84,&local_60);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"CHECK_EQ failed ",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/metric.h"
               ,0x5a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,0x84);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Y.size()",8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"pred.size()",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_90);
    Logger::~Logger(&local_9c);
    abort();
  }
  this->total_example_ = this->total_example_ + (int)(uVar2 >> 2);
  local_90._M_dataplus._M_p = local_90._M_dataplus._M_p & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,
             (this->super_Metric).threadNumber_,(value_type_conflict2 *)&local_90,
             (allocator_type *)&local_9c);
  uVar2 = (this->super_Metric).threadNumber_;
  if (uVar2 == 0) {
    uVar2 = 0;
  }
  else {
    lVar10 = 0;
    uVar8 = 0;
    do {
      uVar3 = (long)(pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(pred->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 2;
      uVar4 = uVar3 / uVar2;
      local_90.field_2._M_allocated_capacity = uVar4 * uVar8;
      uVar9 = uVar8 + 1;
      uVar4 = uVar4 * uVar9;
      local_90._M_dataplus._M_p = (pointer)acc_accum_thread;
      local_90._M_string_length = uVar3 % uVar2 + uVar4;
      if (uVar8 != uVar2 - 1) {
        local_90._M_string_length = uVar4;
      }
      local_90.field_2._8_8_ = local_60._M_dataplus._M_p + lVar10;
      local_68 = local_98;
      local_70 = pred;
      ThreadPool::
      enqueue<std::_Bind<void(*(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,unsigned_int*,unsigned_long,unsigned_long))(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,unsigned_int*,unsigned_long,unsigned_long)>>
                ((ThreadPool *)&stack0xffffffffffffffc0,
                 (_Bind<void_(*(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_long,_unsigned_long))(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_unsigned_int_*,_unsigned_long,_unsigned_long)>
                  *)(this->super_Metric).pool_);
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      }
      uVar2 = (this->super_Metric).threadNumber_;
      lVar10 = lVar10 + 4;
      uVar8 = uVar9;
    } while (uVar9 < uVar2);
  }
  pTVar1 = (this->super_Metric).pool_;
  local_90._M_dataplus._M_p = (pointer)&pTVar1->sync_mutex;
  local_90._M_string_length = local_90._M_string_length & 0xffffffffffffff00;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_90);
  local_90._M_string_length = CONCAT71(local_90._M_string_length._1_7_,1);
  if ((pTVar1->sync).super___atomic_base<int>._M_i != (int)uVar2) {
    do {
      std::condition_variable::wait((unique_lock *)&pTVar1->sync_condition);
    } while ((pTVar1->sync).super___atomic_base<int>._M_i != (int)uVar2);
  }
  LOCK();
  (pTVar1->sync).super___atomic_base<int>._M_i = 0;
  UNLOCK();
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_90);
  if (local_60._M_string_length - (long)local_60._M_dataplus._M_p == 0) {
    if (local_60._M_dataplus._M_p == (pointer)0x0) {
      return;
    }
  }
  else {
    iVar6 = this->true_pred_;
    lVar10 = (long)(local_60._M_string_length - (long)local_60._M_dataplus._M_p) >> 2;
    lVar7 = 0;
    do {
      iVar6 = iVar6 + *(int *)(local_60._M_dataplus._M_p + lVar7 * 4);
      lVar7 = lVar7 + 1;
      this->true_pred_ = iVar6;
    } while (lVar10 + (ulong)(lVar10 == 0) != lVar7);
  }
  operator_delete(local_60._M_dataplus._M_p);
  return;
}

Assistant:

void Accumulate(const std::vector<real_t>& Y,
                  const std::vector<real_t>& pred) {
    CHECK_EQ(Y.size(), pred.size());
    total_example_ += Y.size();
    // multi-thread training
    std::vector<index_t> sum(threadNumber_, 0);
    for (int i = 0; i < threadNumber_; ++i) {
      size_t start_idx = getStart(pred.size(), threadNumber_, i);
      size_t end_idx = getEnd(pred.size(), threadNumber_, i);
      pool_->enqueue(std::bind(acc_accum_thread,
                               &Y,
                               &pred,
                               &(sum[i]),
                               start_idx,
                               end_idx));
    }
    // Wait all of the threads finish their job
    pool_->Sync(threadNumber_);
    for (size_t i = 0; i < sum.size(); ++i) {
      true_pred_ += sum[i];
    }
  }